

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O2

void test_memoryAllocation(void)

{
  create_DecodedResult_storage_withNullInput_returnsNull();
  create_DecodedResult_storage_withZeroLengthInput_returnsNull();
  create_DecodedResult_storage_withMalformedInput_returnsNull();
  create_DecodedResult_storage_minimalExample_isSuccessful();
  create_DecodedResult_storage_smallExample_isSuccessful();
  create_encoded_string_storage_withMalformedInput_returnsNull();
  create_encoded_string_storage_minimalExample_isSuccessful();
  create_encoded_string_storage_smallExample_isSuccessful();
  create_encoded_string_storage_from_DecodedResult_withNullInput_returnsNull();
  create_encoded_string_storage_from_DecodedResult_withMalformedInput_returnsNull();
  create_encoded_string_storage_from_DecodedResult_minimalExample_isSuccessful();
  create_encoded_string_storage_from_DecodedResult_smallExample_isSuccessful();
  return;
}

Assistant:

void test_memoryAllocation(void) {
    create_DecodedResult_storage_withNullInput_returnsNull();
    create_DecodedResult_storage_withZeroLengthInput_returnsNull();
    create_DecodedResult_storage_withMalformedInput_returnsNull();
    create_DecodedResult_storage_minimalExample_isSuccessful();
    create_DecodedResult_storage_smallExample_isSuccessful();

    create_encoded_string_storage_withMalformedInput_returnsNull();
    create_encoded_string_storage_minimalExample_isSuccessful();
    create_encoded_string_storage_smallExample_isSuccessful();

    create_encoded_string_storage_from_DecodedResult_withNullInput_returnsNull();
    create_encoded_string_storage_from_DecodedResult_withMalformedInput_returnsNull();
    create_encoded_string_storage_from_DecodedResult_minimalExample_isSuccessful();
    create_encoded_string_storage_from_DecodedResult_smallExample_isSuccessful();
}